

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64_decode.c
# Opt level: O3

void base64_decode_bs(BinarySink *bs,ptrlen input)

{
  BinarySink *bs_00;
  uchar uVar1;
  int iVar2;
  size_t i;
  ulong uVar3;
  char b64atom [4];
  uchar binatom [3];
  BinarySource src [1];
  uchar local_5f [4];
  uchar local_5b [3];
  BinarySource local_58;
  
  local_58.len = input.len;
  local_58.data = input.ptr;
  local_58.binarysource_ = &local_58;
  local_58.pos = 0;
  local_58.err = BSE_NO_ERROR;
  if (local_58.len != 0) {
    do {
      uVar3 = 0;
      do {
        uVar1 = BinarySource_get_byte(local_58.binarysource_);
        if ((local_58.binarysource_)->err != BSE_NO_ERROR) {
          uVar1 = '=';
        }
        if ((uVar1 != '\n') && (uVar1 != '\r')) {
          local_5f[uVar3] = uVar1;
          uVar3 = uVar3 + 1;
        }
      } while (uVar3 < 4);
      bs_00 = bs->binarysink_;
      iVar2 = base64_decode_atom((char *)local_5f,local_5b);
      BinarySink_put_data(bs_00,local_5b,(long)iVar2);
    } while ((local_58.binarysource_)->len != (local_58.binarysource_)->pos);
  }
  return;
}

Assistant:

void base64_decode_bs(BinarySink *bs, ptrlen input)
{
    BinarySource src[1];
    BinarySource_BARE_INIT_PL(src, input);

    while (get_avail(src)) {
        char b64atom[4];
        unsigned char binatom[3];

        for (size_t i = 0; i < 4 ;) {
            char c = get_byte(src);
            if (get_err(src))
                c = '=';
            if (c == '\n' || c == '\r')
                continue;
            b64atom[i++] = c;
        }

        put_data(bs, binatom, base64_decode_atom(b64atom, binatom));
    }
}